

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absDup.c
# Opt level: O1

Gia_Man_t * Gia_ManDupAbsFlops(Gia_Man_t *p,Vec_Int_t *vFlopClasses)

{
  char *pcVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pGVar3;
  Gia_Man_t *p_00;
  size_t sVar4;
  char *pcVar5;
  Gia_Obj_t *pGVar6;
  Vec_Int_t *pVVar7;
  Gia_Man_t *pGVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  
  Gia_ManFillValue(p);
  p_00 = Gia_ManStart(5000);
  pcVar1 = p->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    sVar4 = strlen(pcVar1);
    pcVar5 = (char *)malloc(sVar4 + 1);
    strcpy(pcVar5,pcVar1);
  }
  p_00->pName = pcVar5;
  pcVar1 = p->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    sVar4 = strlen(pcVar1);
    pcVar5 = (char *)malloc(sVar4 + 1);
    strcpy(pcVar5,pcVar1);
  }
  p_00->pSpec = pcVar5;
  p->pObjs->Value = 0;
  pVVar7 = p->vCis;
  uVar9 = (ulong)(uint)pVVar7->nSize;
  if (p->nRegs < pVVar7->nSize) {
    lVar13 = 0;
    do {
      if ((int)uVar9 <= lVar13) goto LAB_005efcdd;
      iVar12 = pVVar7->pArray[lVar13];
      if (((long)iVar12 < 0) || (p->nObjs <= iVar12)) goto LAB_005efcbe;
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      pGVar6 = Gia_ManAppendObj(p_00);
      uVar9 = *(ulong *)pGVar6;
      *(ulong *)pGVar6 = uVar9 | 0x9fffffff;
      *(ulong *)pGVar6 =
           uVar9 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar3 = p_00->pObjs;
      if ((pGVar6 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar6)) goto LAB_005efcfc;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar6 - (long)pGVar3) >> 2) * -0x55555555);
      pGVar3 = p_00->pObjs;
      if ((pGVar6 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar6)) goto LAB_005efcfc;
      pGVar2[iVar12].Value = (int)((ulong)((long)pGVar6 - (long)pGVar3) >> 2) * 0x55555556;
      lVar13 = lVar13 + 1;
      pVVar7 = p->vCis;
      uVar9 = (ulong)pVVar7->nSize;
    } while (lVar13 < (long)(uVar9 - (long)p->nRegs));
  }
  uVar9 = (ulong)(uint)p->nRegs;
  if (0 < p->nRegs) {
    lVar13 = 0;
    do {
      iVar12 = p->vCis->nSize;
      uVar9 = (ulong)(uint)(iVar12 - (int)uVar9) + lVar13;
      iVar10 = (int)uVar9;
      if ((iVar10 < 0) || (iVar12 <= iVar10)) goto LAB_005efcdd;
      iVar12 = p->vCis->pArray[uVar9 & 0xffffffff];
      if (((long)iVar12 < 0) || (p->nObjs <= iVar12)) goto LAB_005efcbe;
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      if (vFlopClasses->nSize <= lVar13) goto LAB_005efcdd;
      if (vFlopClasses->pArray[lVar13] == 0) {
        pGVar6 = Gia_ManAppendObj(p_00);
        uVar9 = *(ulong *)pGVar6;
        *(ulong *)pGVar6 = uVar9 | 0x9fffffff;
        *(ulong *)pGVar6 =
             uVar9 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar3 = p_00->pObjs;
        if ((pGVar6 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar6)) goto LAB_005efcfc;
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar6 - (long)pGVar3) >> 2) * -0x55555555);
        pGVar3 = p_00->pObjs;
        if ((pGVar6 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar6)) goto LAB_005efcfc;
        pGVar2[iVar12].Value = (int)((ulong)((long)pGVar6 - (long)pGVar3) >> 2) * 0x55555556;
      }
      lVar13 = lVar13 + 1;
      uVar9 = (ulong)p->nRegs;
    } while (lVar13 < (long)uVar9);
  }
  uVar9 = (ulong)(uint)p->nRegs;
  if (0 < p->nRegs) {
    lVar13 = 0;
    do {
      iVar12 = p->vCis->nSize;
      uVar9 = (ulong)(uint)(iVar12 - (int)uVar9) + lVar13;
      iVar10 = (int)uVar9;
      if ((iVar10 < 0) || (iVar12 <= iVar10)) goto LAB_005efcdd;
      iVar12 = p->vCis->pArray[uVar9 & 0xffffffff];
      if (((long)iVar12 < 0) || (p->nObjs <= iVar12)) goto LAB_005efcbe;
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      if (vFlopClasses->nSize <= lVar13) goto LAB_005efcdd;
      if (vFlopClasses->pArray[lVar13] != 0) {
        pGVar6 = Gia_ManAppendObj(p_00);
        uVar9 = *(ulong *)pGVar6;
        *(ulong *)pGVar6 = uVar9 | 0x9fffffff;
        *(ulong *)pGVar6 =
             uVar9 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar3 = p_00->pObjs;
        if ((pGVar6 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar6)) {
LAB_005efcfc:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar6 - (long)pGVar3) >> 2) * -0x55555555);
        pGVar3 = p_00->pObjs;
        if ((pGVar6 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar6)) goto LAB_005efcfc;
        pGVar2[iVar12].Value = (int)((ulong)((long)pGVar6 - (long)pGVar3) >> 2) * 0x55555556;
      }
      lVar13 = lVar13 + 1;
      uVar9 = (ulong)p->nRegs;
    } while (lVar13 < (long)uVar9);
  }
  Gia_ManHashAlloc(p_00);
  pVVar7 = p->vCos;
  uVar9 = (ulong)(uint)pVVar7->nSize;
  if (p->nRegs < pVVar7->nSize) {
    lVar13 = 0;
    do {
      if ((int)uVar9 <= lVar13) goto LAB_005efcdd;
      iVar12 = pVVar7->pArray[lVar13];
      if (((long)iVar12 < 0) || (p->nObjs <= iVar12)) goto LAB_005efcbe;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar2 = p->pObjs + iVar12;
      Gia_ManDupAbsFlops_rec(p_00,pGVar2 + -(*(ulong *)pGVar2 & 0x1fffffff));
      if ((int)pGVar2[-(*(ulong *)pGVar2 & 0x1fffffff)].Value < 0) goto LAB_005efd1b;
      Gia_ManAppendCo(p_00,(uint)(*(ulong *)pGVar2 >> 0x1d) & 1 ^
                           pGVar2[-(*(ulong *)pGVar2 & 0x1fffffff)].Value);
      lVar13 = lVar13 + 1;
      pVVar7 = p->vCos;
      uVar9 = (ulong)pVVar7->nSize;
    } while (lVar13 < (long)(uVar9 - (long)p->nRegs));
  }
  uVar9 = (ulong)(uint)p->nRegs;
  if (p->nRegs < 1) {
    iVar12 = 0;
  }
  else {
    lVar13 = 0;
    iVar12 = 0;
    do {
      iVar10 = p->vCos->nSize;
      uVar9 = (ulong)(uint)(iVar10 - (int)uVar9) + lVar13;
      iVar11 = (int)uVar9;
      if ((iVar11 < 0) || (iVar10 <= iVar11)) {
LAB_005efcdd:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar10 = p->vCos->pArray[uVar9 & 0xffffffff];
      if (((long)iVar10 < 0) || (p->nObjs <= iVar10)) {
LAB_005efcbe:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (vFlopClasses->nSize <= lVar13) goto LAB_005efcdd;
      if (vFlopClasses->pArray[lVar13] != 0) {
        pGVar2 = p->pObjs + iVar10;
        Gia_ManDupAbsFlops_rec(p_00,pGVar2 + -(*(ulong *)pGVar2 & 0x1fffffff));
        if ((int)pGVar2[-(*(ulong *)pGVar2 & 0x1fffffff)].Value < 0) {
LAB_005efd1b:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        Gia_ManAppendCo(p_00,(uint)(*(ulong *)pGVar2 >> 0x1d) & 1 ^
                             pGVar2[-(*(ulong *)pGVar2 & 0x1fffffff)].Value);
        iVar12 = iVar12 + 1;
      }
      lVar13 = lVar13 + 1;
      uVar9 = (ulong)p->nRegs;
    } while (lVar13 < (long)uVar9);
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,iVar12);
  pGVar8 = Gia_ManSeqCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar8;
}

Assistant:

Gia_Man_t * Gia_ManDupAbsFlops( Gia_Man_t * p, Vec_Int_t * vFlopClasses )
{ 
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, nFlops = 0;
    Gia_ManFillValue( p );
    // start the new manager
    pNew = Gia_ManStart( 5000 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // create PIs
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    // create additional PIs
    Gia_ManForEachRo( p, pObj, i )
        if ( !Vec_IntEntry(vFlopClasses, i) )
            pObj->Value = Gia_ManAppendCi(pNew);
    // create ROs
    Gia_ManForEachRo( p, pObj, i )
        if ( Vec_IntEntry(vFlopClasses, i) )
            pObj->Value = Gia_ManAppendCi(pNew);
    // create POs
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachPo( p, pObj, i )
    {
        Gia_ManDupAbsFlops_rec( pNew, Gia_ObjFanin0(pObj) );
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
    // create RIs
    Gia_ManForEachRi( p, pObj, i )
        if ( Vec_IntEntry(vFlopClasses, i) )
        {
            Gia_ManDupAbsFlops_rec( pNew, Gia_ObjFanin0(pObj) );
            Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
            nFlops++;
        }
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, nFlops );
    // clean up
    pNew = Gia_ManSeqCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}